

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O2

Elf64_Phdr * __thiscall
absl::lts_20250127::debugging_internal::ElfMemImage::GetPhdr(ElfMemImage *this,int index)

{
  Elf64_Ehdr *pEVar1;
  
  if ((-1 < index) && (pEVar1 = this->ehdr_, (uint)index < (uint)pEVar1->e_phnum)) {
    return (Elf64_Phdr *)
           (pEVar1->e_ident + (ulong)(uint)index * (ulong)pEVar1->e_phentsize + pEVar1->e_phoff);
  }
  raw_log_internal::RawLog
            (kFatal,"elf_mem_image.cc",0x69,"Check %s failed: %s",
             "index >= 0 && index < ehdr_->e_phnum","index out of range");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                ,0x69,"const Elf64_Phdr *absl::debugging_internal::ElfMemImage::GetPhdr(int) const")
  ;
}

Assistant:

const ElfW(Phdr) *ElfMemImage::GetPhdr(int index) const {
  ABSL_RAW_CHECK(index >= 0 && index < ehdr_->e_phnum, "index out of range");
  return GetTableElement<ElfW(Phdr)>(ehdr_, ehdr_->e_phoff, ehdr_->e_phentsize,
                                     static_cast<size_t>(index));
}